

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

int __thiscall smf::MidiMessage::setSizeToCommand(MidiMessage *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int local_28;
  int local_24;
  int i;
  int bytecount;
  int command;
  int osize;
  MidiMessage *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  local_28 = (int)sVar2;
  if (local_28 < 1) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = getCommandNibble(this);
    if (iVar1 < 0) {
      this_local._4_4_ = 0;
    }
    else {
      if (iVar1 == 0x80) {
        local_24 = 2;
      }
      else if (iVar1 == 0x90) {
        local_24 = 2;
      }
      else if (iVar1 == 0xa0) {
        local_24 = 2;
      }
      else if (iVar1 == 0xb0) {
        local_24 = 2;
      }
      else if (iVar1 == 0xc0) {
        local_24 = 1;
      }
      else if (iVar1 == 0xd0) {
        local_24 = 1;
      }
      else {
        if (iVar1 != 0xe0) {
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
          return (int)sVar2;
        }
        local_24 = 2;
      }
      if (local_24 + 1 < local_28) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                   (long)(local_24 + 1));
        for (; local_28 < local_24 + 1; local_28 = local_28 + 1) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                              (long)local_28);
          *pvVar3 = '\0';
        }
      }
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
      this_local._4_4_ = (int)sVar2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MidiMessage::setSizeToCommand(void) {
	int osize = (int)this->size();
	if (osize < 1) {
		return 0;
	}
	int command = getCommandNibble();
	if (command < 0) {
		return 0;
	}
	int bytecount = 1;
	switch (command) {
		case 0x80: bytecount = 2; break;  // Note Off
		case 0x90: bytecount = 2; break;  // Note On
		case 0xA0: bytecount = 2; break;  // Aftertouch
		case 0xB0: bytecount = 2; break;  // Continuous Controller
		case 0xC0: bytecount = 1; break;  // Patch Change
		case 0xD0: bytecount = 1; break;  // Channel Pressure
		case 0xE0: bytecount = 2; break;  // Pitch Bend
		case 0xF0:
		default:
			return (int)size();
	}
	if (bytecount + 1 < osize) {
		resize(bytecount+1);
		for (int i=osize; i<bytecount+1; i++) {
			(*this)[i] = 0;
		}
	}

	return (int)size();
}